

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O2

ZipEntry __thiscall Zippy::ZipArchive::GetEntry(ZipArchive *this,string *name)

{
  pointer pBuf;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  _Var1;
  ZipLogicError *this_00;
  ZipRuntimeError *this_01;
  char *__s;
  undefined8 *in_RDX;
  ZipEntry *extraout_RDX;
  ZipEntry *extraout_RDX_00;
  ZipEntry *pZVar2;
  ZipEntry ZVar3;
  allocator<char> local_51;
  string local_50;
  
  if (name[4].field_2._M_local_buf[8] == '\0') {
    this_00 = (ZipLogicError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Cannot call GetEntry on empty ZipArchive object!",&local_51);
    ZipLogicError::ZipLogicError(this_00,&local_50);
    __cxa_throw(this_00,&ZipLogicError::typeinfo,std::logic_error::~logic_error);
  }
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<Zippy::Impl::ZipEntry*,std::vector<Zippy::Impl::ZipEntry,std::allocator<Zippy::Impl::ZipEntry>>>,__gnu_cxx::__ops::_Iter_pred<Zippy::ZipArchive::GetEntry(std::__cxx11::string_const&)::_lambda(Zippy::Impl::ZipEntry_const&)_1_>>
                    (name[5]._M_dataplus._M_p,name[5]._M_string_length);
  pZVar2 = extraout_RDX;
  if (((_Var1._M_current)->m_EntryData).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      ((_Var1._M_current)->m_EntryData).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&(_Var1._M_current)->m_EntryData,((_Var1._M_current)->m_EntryInfo).m_uncomp_size);
    pBuf = ((_Var1._M_current)->m_EntryData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    mz_zip_reader_extract_file_to_mem
              ((mz_zip_archive *)&name->_M_string_length,(char *)*in_RDX,pBuf,
               (long)((_Var1._M_current)->m_EntryData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pBuf,0);
    pZVar2 = extraout_RDX_00;
  }
  if ((((_Var1._M_current)->m_EntryInfo).m_is_directory == 0) &&
     (((_Var1._M_current)->m_EntryData).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0)) {
    this_01 = (ZipRuntimeError *)__cxa_allocate_exception(0x10);
    __s = mz_zip_get_error_string(*(mz_zip_error *)((long)&name[1]._M_dataplus._M_p + 4));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
    ZipRuntimeError::ZipRuntimeError(this_01,&local_50);
    __cxa_throw(this_01,&ZipRuntimeError::typeinfo,std::runtime_error::~runtime_error);
  }
  this->_vptr_ZipArchive = (_func_int **)&PTR__ZipEntry_00179e30;
  (this->m_Archive).m_archive_size = (mz_uint64)_Var1._M_current;
  ZVar3.m_ZipEntry = pZVar2;
  ZVar3._vptr_ZipEntry = (_func_int **)this;
  return ZVar3;
}

Assistant:

ZipEntry GetEntry(const std::string& name) {

            if (!IsOpen()) throw ZipLogicError("Cannot call GetEntry on empty ZipArchive object!");

            // ===== Look up ZipEntry object.
            auto result = std::find_if(m_ZipEntries.begin(), m_ZipEntries.end(), [&](const Impl::ZipEntry& entry) {
                return name == entry.GetName();
            });

            // ===== If data has not been extracted from the archive (i.e., m_EntryData is empty),
            // ===== extract the data from the archive to the ZipEntry object.
            if (result->m_EntryData.empty()) {
                result->m_EntryData.resize(result->UncompressedSize());
                mz_zip_reader_extract_file_to_mem(&m_Archive, name.c_str(), result->m_EntryData.data(),
                                                  result->m_EntryData.size(), 0);
            }

            // ===== Check that the operation was successful
            if (!result->IsDirectory() && result->m_EntryData.data() == nullptr)
                throw ZipRuntimeError(mz_zip_get_error_string(m_Archive.m_last_error));

            // ===== Return ZipEntry object with the file data.
            return ZipEntry(&*result);
        }